

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sliced_Wasserstein.h
# Opt level: O3

double __thiscall
Gudhi::Persistence_representations::Sliced_Wasserstein::compute_int_cos
          (Sliced_Wasserstein *this,double alpha,double beta)

{
  double dVar1;
  double local_10;
  
  local_10 = 0.0;
  if ((0.0 <= alpha) && (alpha <= 3.141592653589793)) {
    dVar1 = cos(alpha);
    if (0.0 <= dVar1) {
      if (1.5707963267948966 <= beta) {
        local_10 = sin(alpha);
        local_10 = 2.0 - local_10;
        dVar1 = beta;
      }
      else {
        local_10 = sin(beta);
        dVar1 = alpha;
      }
      dVar1 = sin(dVar1);
      local_10 = local_10 - dVar1;
    }
    else {
      local_10 = sin(alpha);
      if (4.71238898038469 <= beta) {
        dVar1 = sin(beta);
        local_10 = dVar1 + local_10 + 2.0;
      }
      else {
        dVar1 = sin(beta);
        local_10 = local_10 - dVar1;
      }
    }
  }
  if ((-3.141592653589793 <= alpha) && (alpha <= 0.0)) {
    dVar1 = cos(alpha);
    if (dVar1 <= 0.0) {
      local_10 = sin(alpha);
      if (-1.5707963267948966 <= beta) {
        dVar1 = sin(beta);
        return dVar1 + local_10 + 2.0;
      }
      dVar1 = sin(beta);
    }
    else {
      if (1.5707963267948966 <= beta) {
        local_10 = sin(alpha);
        local_10 = 2.0 - local_10;
        alpha = beta;
      }
      else {
        local_10 = sin(beta);
      }
      dVar1 = sin(alpha);
    }
    local_10 = local_10 - dVar1;
  }
  return local_10;
}

Assistant:

double compute_int_cos(double alpha, double beta) const {
    double res = 0;
    if (alpha >= 0 && alpha <= pi) {
      if (cos(alpha) >= 0) {
        if (pi / 2 <= beta) {
          res = 2 - sin(alpha) - sin(beta);
        } else {
          res = sin(beta) - sin(alpha);
        }
      } else {
        if (1.5 * pi <= beta) {
          res = 2 + sin(alpha) + sin(beta);
        } else {
          res = sin(alpha) - sin(beta);
        }
      }
    }
    if (alpha >= -pi && alpha <= 0) {
      if (cos(alpha) <= 0) {
        if (-pi / 2 <= beta) {
          res = 2 + sin(alpha) + sin(beta);
        } else {
          res = sin(alpha) - sin(beta);
        }
      } else {
        if (pi / 2 <= beta) {
          res = 2 - sin(alpha) - sin(beta);
        } else {
          res = sin(beta) - sin(alpha);
        }
      }
    }
    return res;
  }